

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkpoint_manager.cpp
# Opt level: O1

void __thiscall
duckdb::CheckpointReader::ReadEntry
          (CheckpointReader *this,CatalogTransaction transaction,Deserializer *deserializer)

{
  CatalogType CVar1;
  uint uVar2;
  long lVar3;
  InternalException *this_00;
  string local_40;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,99,"type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_40,deserializer);
    CVar1 = EnumUtil::FromString<duckdb::CatalogType>(local_40._M_dataplus._M_p);
    uVar2 = (uint)CVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  else {
    uVar2 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  uVar2 = uVar2 & 0xff;
  switch(uVar2) {
  case 1:
    lVar3 = 0x28;
    break;
  case 2:
    lVar3 = 0x20;
    break;
  case 3:
    lVar3 = 0x30;
    break;
  case 4:
    lVar3 = 0x50;
    break;
  case 5:
  case 7:
switchD_017e435e_caseD_5:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Unrecognized catalog type in CheckpointWriter::WriteEntry","");
    InternalException::InternalException(this_00,&local_40);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case 6:
    lVar3 = 0x38;
    break;
  case 8:
    lVar3 = 0x58;
    break;
  default:
    if (uVar2 == 0x1e) {
      lVar3 = 0x40;
    }
    else {
      if (uVar2 != 0x1f) goto switchD_017e435e_caseD_5;
      lVar3 = 0x48;
    }
  }
  (**(code **)((long)this->_vptr_CheckpointReader + lVar3))(this,deserializer);
  return;
}

Assistant:

void CheckpointReader::ReadEntry(CatalogTransaction transaction, Deserializer &deserializer) {
	auto type = deserializer.ReadProperty<CatalogType>(99, "type");

	switch (type) {
	case CatalogType::SCHEMA_ENTRY: {
		ReadSchema(transaction, deserializer);
		break;
	}
	case CatalogType::TYPE_ENTRY: {
		ReadType(transaction, deserializer);
		break;
	}
	case CatalogType::SEQUENCE_ENTRY: {
		ReadSequence(transaction, deserializer);
		break;
	}
	case CatalogType::TABLE_ENTRY: {
		ReadTable(transaction, deserializer);
		break;
	}
	case CatalogType::VIEW_ENTRY: {
		ReadView(transaction, deserializer);
		break;
	}
	case CatalogType::MACRO_ENTRY: {
		ReadMacro(transaction, deserializer);
		break;
	}
	case CatalogType::TABLE_MACRO_ENTRY: {
		ReadTableMacro(transaction, deserializer);
		break;
	}
	case CatalogType::INDEX_ENTRY: {
		ReadIndex(transaction, deserializer);
		break;
	}
	default:
		throw InternalException("Unrecognized catalog type in CheckpointWriter::WriteEntry");
	}
}